

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

void VmExtractOptArgValue
               (jx9_value *pArray,jx9_value *pWorker,char *zArg,char *zArgEnd,int need_val,
               jx9_context *pCtx,char *zName)

{
  char cVar1;
  uint uVar2;
  ushort **ppuVar3;
  jx9_value *pValue;
  char *pcVar4;
  char *zString;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  bool bVar13;
  
  jx9MemObjRelease(pWorker);
  (pWorker->x).rVal = 0.0;
  pWorker->iFlags = pWorker->iFlags & 0xfffffe90U | 8;
  if (need_val != 0) {
    pcVar12 = zArg + 1;
    if ((pcVar12 < zArgEnd) && (zArg[1] == '=')) {
      pcVar12 = zArg + 2;
    }
    if (pcVar12 < zArgEnd) {
      lVar9 = 0;
      lVar5 = 0;
      do {
        cVar1 = pcVar12[lVar9];
        if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) == 0
           )) {
          pcVar10 = zArgEnd + (lVar5 - (long)pcVar12);
          zString = pcVar12 + -lVar5;
          if ((cVar1 == '\"') || (cVar1 == '\'')) {
            pcVar7 = pcVar12 + (1 - lVar5);
            if (pcVar7 < zArgEnd) {
              bVar13 = true;
              pcVar4 = (char *)0x1;
              pcVar11 = pcVar7;
              goto LAB_0012cf38;
            }
            uVar6 = 0;
            pcVar8 = pcVar7;
            goto LAB_0012cf67;
          }
          if (cVar1 != '-') {
            pcVar8 = zString;
            if (zArgEnd <= zString) goto LAB_0012cfb8;
            ppuVar3 = __ctype_b_loc();
            pcVar7 = zString;
            goto LAB_0012cfa1;
          }
          break;
        }
        lVar5 = lVar5 + -1;
        lVar9 = lVar9 + 1;
      } while (zArgEnd + (lVar5 - (long)pcVar12) != (char *)0x0);
    }
  }
  goto LAB_0012d017;
  while( true ) {
    pcVar11 = pcVar11 + 1;
    bVar13 = pcVar11 < zArgEnd;
    pcVar4 = pcVar4 + 1;
    pcVar8 = zString + (long)(zArgEnd + (lVar5 - (long)pcVar12));
    if (pcVar10 == pcVar4) break;
LAB_0012cf38:
    if ((*pcVar11 == cVar1) && (pcVar8 = pcVar11, pcVar11[-1] != '\\')) break;
  }
  uVar6 = (ulong)bVar13;
LAB_0012cf67:
  jx9_value_string(pWorker,pcVar7,(int)lVar5 + (int)pcVar8 + ~(uint)pcVar12);
  pcVar8 = pcVar8 + uVar6;
  goto LAB_0012cfd1;
  while( true ) {
    pcVar7 = pcVar7 + 1;
    pcVar10 = pcVar10 + -1;
    pcVar8 = zString + (long)(zArgEnd + (lVar5 - (long)pcVar12));
    if (pcVar10 == (char *)0x0) break;
LAB_0012cfa1:
    pcVar8 = pcVar7;
    if ((*(byte *)((long)*ppuVar3 + (long)*pcVar7 * 2 + 1) & 0x20) != 0) break;
  }
LAB_0012cfb8:
  jx9_value_string(pWorker,zString,(int)lVar5 + ((int)pcVar8 - (uint)pcVar12));
LAB_0012cfd1:
  if (pcVar8 < zArgEnd) {
    lVar5 = (long)zArgEnd - (long)pcVar8;
    do {
      cVar1 = *pcVar8;
      if (0xffffffffffffffbf < (ulong)(long)cVar1) {
LAB_0012d02a:
        pValue = jx9_context_new_array(pCtx);
        if (pValue == (jx9_value *)0x0) {
          jx9VmThrowError(pCtx->pVm,&pCtx->pFunc->sName,1,"JX9 is running out of memory");
          return;
        }
        if ((pValue->iFlags & 0x40) != 0) {
          HashmapInsert((jx9_hashmap *)(pValue->x).pOther,(jx9_value *)0x0,pWorker);
        }
        do {
          do {
            if ((zArgEnd <= pcVar8) || (*pcVar8 == '-')) {
              jx9_array_add_strkey_elem(pArray,zName,pValue);
              jx9_context_release_value(pCtx,pValue);
              return;
            }
            pcVar8 = pcVar8 + (*pcVar8 == '\\');
            pcVar12 = pcVar8;
            if (pcVar8 < zArgEnd) {
              ppuVar3 = __ctype_b_loc();
              pcVar10 = pcVar8;
              do {
                pcVar12 = pcVar10;
                if ((*(byte *)((long)*ppuVar3 + (long)*pcVar10 * 2 + 1) & 0x20) != 0) break;
                pcVar10 = pcVar10 + 1;
                pcVar12 = zArgEnd;
              } while (pcVar10 < zArgEnd);
            }
            (pWorker->sBlob).nByte = 0;
            uVar2 = (pWorker->sBlob).nFlags;
            if ((uVar2 & 4) != 0) {
              (pWorker->sBlob).pBlob = (void *)0x0;
              (pWorker->sBlob).mByte = 0;
              (pWorker->sBlob).nFlags = uVar2 & 0xfffffffb;
            }
            jx9_value_string(pWorker,pcVar8,(int)pcVar12 - (int)pcVar8);
            if ((pValue->iFlags & 0x40) != 0) {
              HashmapInsert((jx9_hashmap *)(pValue->x).pOther,(jx9_value *)0x0,pWorker);
            }
            pcVar8 = pcVar12;
          } while (zArgEnd <= pcVar12);
          lVar5 = (long)zArgEnd - (long)pcVar12;
          do {
            cVar1 = *pcVar12;
            pcVar8 = pcVar12;
            if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
               (ppuVar3 = __ctype_b_loc(),
               (*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) == 0)) break;
            pcVar12 = pcVar12 + 1;
            lVar5 = lVar5 + -1;
            pcVar8 = zArgEnd;
          } while (lVar5 != 0);
        } while( true );
      }
      ppuVar3 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
        if (cVar1 != '-') goto LAB_0012d02a;
        break;
      }
      pcVar8 = pcVar8 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
LAB_0012d017:
  jx9_array_add_strkey_elem(pArray,zName,pWorker);
  return;
}

Assistant:

static void VmExtractOptArgValue(
	jx9_value *pArray,  /* getopt() return value */
	jx9_value *pWorker, /* Worker variable */
	const char *zArg,   /* Argument stream */
	const char *zArgEnd, /* End of the argument stream  */
	int need_val,       /* TRUE to fetch option argument */
	jx9_context *pCtx,  /* Call Context */
	const char *zName   /* Option name */)
{
	jx9_value_bool(pWorker, 0);
	if( !need_val ){
		/* 
		 * Option does not need arguments.
		 * Insert the option name and a boolean FALSE.
		 */
		jx9_array_add_strkey_elem(pArray, (const char *)zName, pWorker); /* Will make it's own copy */
	}else{
		const char *zCur;
		/* Extract option argument */
		zArg++;
		if( zArg < zArgEnd && zArg[0] == '=' ){
			zArg++;
		}
		while( zArg < zArgEnd && (unsigned char)zArg[0] < 0xc0 && SyisSpace(zArg[0]) ){
			zArg++;
		}
		if( zArg >= zArgEnd || zArg[0] == '-' ){
			/*
			 * Argument not found.
			 * Insert the option name and a boolean FALSE.
			 */
			jx9_array_add_strkey_elem(pArray, (const char *)zName, pWorker); /* Will make it's own copy */
			return;
		}
		/* Delimit the value */
		zCur = zArg;
		if( zArg[0] == '\'' || zArg[0] == '"' ){
			int d = zArg[0];
			/* Delimt the argument */
			zArg++;
			zCur = zArg;
			while( zArg < zArgEnd ){
				if( zArg[0] == d && zArg[-1] != '\\' ){
					/* Delimiter found, exit the loop  */
					break;
				}
				zArg++;
			}
			/* Save the value */
			jx9_value_string(pWorker, zCur, (int)(zArg-zCur));
			if( zArg < zArgEnd ){ zArg++; }
		}else{
			while( zArg < zArgEnd && !SyisSpace(zArg[0]) ){
				zArg++;
			}
			/* Save the value */
			jx9_value_string(pWorker, zCur, (int)(zArg-zCur));
		}
		/*
		 * Check if we are dealing with multiple values.
		 * If so, create an array to hold them, rather than a scalar variable.
		 */
		while( zArg < zArgEnd && (unsigned char)zArg[0] < 0xc0 && SyisSpace(zArg[0]) ){
			zArg++;
		}
		if( zArg < zArgEnd && zArg[0] != '-' ){
			jx9_value *pOptArg; /* Array of option arguments */
			pOptArg = jx9_context_new_array(pCtx);
			if( pOptArg == 0 ){
				jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
			}else{
				/* Insert the first value */
				jx9_array_add_elem(pOptArg, 0, pWorker); /* Will make it's own copy */
				for(;;){
					if( zArg >= zArgEnd || zArg[0] == '-' ){
						/* No more value */
						break;
					}
					/* Delimit the value */
					zCur = zArg;
					if( zArg < zArgEnd && zArg[0] == '\\' ){
						zArg++;
						zCur = zArg;
					}
					while( zArg < zArgEnd && !SyisSpace(zArg[0]) ){
						zArg++;
					}
					/* Reset the string cursor */
					jx9_value_reset_string_cursor(pWorker);
					/* Save the value */
					jx9_value_string(pWorker, zCur, (int)(zArg-zCur));
					/* Insert */
					jx9_array_add_elem(pOptArg, 0, pWorker); /* Will make it's own copy */
					/* Jump trailing white spaces */
					while( zArg < zArgEnd && (unsigned char)zArg[0] < 0xc0 && SyisSpace(zArg[0]) ){
						zArg++;
					}
				}
				/* Insert the option arg array */
				jx9_array_add_strkey_elem(pArray, (const char *)zName, pOptArg); /* Will make it's own copy */
				/* Safely release */
				jx9_context_release_value(pCtx, pOptArg);
			}
		}else{
			/* Single value */
			jx9_array_add_strkey_elem(pArray, (const char *)zName, pWorker); /* Will make it's own copy */
		}
	}
}